

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(Array2D<Imf_3_4::Rgba> *this,long sizeX,long sizeY)

{
  Rgba *pRVar1;
  
  this->_sizeX = sizeX;
  this->_sizeY = sizeY;
  pRVar1 = (Rgba *)operator_new__(-(ulong)((ulong)(sizeY * sizeX) >> 0x3d != 0) | sizeY * sizeX * 8)
  ;
  this->_data = pRVar1;
  return;
}

Assistant:

inline Array2D<T>::Array2D (long sizeX, long sizeY)
    : _sizeX (sizeX), _sizeY (sizeY), _data (new T[sizeX * sizeY])
{
    // empty
}